

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

int get_data_cache_size(int cpuid,int level)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  size_t sVar3;
  value_type_conflict3 *pvVar4;
  reference pvVar5;
  int in_ESI;
  uint in_EDI;
  size_t j;
  bool thread_siblings_exists;
  int thread_siblings;
  int i_2;
  vector<int,_std::allocator<int>_> thread_set;
  int shared_physical_cpu_count;
  char x;
  int i_1;
  int ci;
  int len;
  int nscan_3;
  char shared_cpu_map_str [256];
  FILE *fp_3;
  CpuSet shared_cpu_map;
  int nscan_2;
  FILE *fp_2;
  int cache_size_K;
  int nscan_1;
  char type [32];
  FILE *fp_1;
  int nscan;
  int cache_level;
  FILE *fp;
  int i;
  int indexid;
  char path [256];
  undefined4 in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb4;
  value_type_conflict3 *pvVar6;
  value_type_conflict3 *__x;
  uint in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc4;
  int local_32c;
  vector<int,_std::allocator<int>_> local_328;
  int local_310;
  byte local_309;
  int local_308;
  int local_304;
  int local_300;
  uint local_2fc;
  byte local_2f8 [200];
  int in_stack_fffffffffffffdd0;
  CpuSet local_1f0;
  uint local_16c;
  FILE *local_168;
  int local_160;
  int local_15c;
  char local_158 [32];
  FILE *local_138;
  int local_130;
  int local_12c;
  FILE *local_128;
  uint local_120;
  uint local_11c;
  char local_118 [268];
  int local_c;
  uint local_8;
  int local_4;
  
  local_11c = 0xffffffff;
  local_120 = 0;
  local_c = in_ESI;
  local_8 = in_EDI;
  do {
    sprintf(local_118,"/sys/devices/system/cpu/cpu%d/cache/index%d/level",(ulong)local_8,
            (ulong)local_120);
    local_128 = fopen(local_118,"rb");
    if (local_128 == (FILE *)0x0) {
LAB_00173f6d:
      if (local_11c == 0xffffffff) {
        local_4 = 0;
      }
      else {
        local_160 = 0;
        sprintf(local_118,"/sys/devices/system/cpu/cpu%d/cache/index%d/size",(ulong)local_8,
                (ulong)local_11c);
        local_168 = fopen(local_118,"rb");
        if (local_168 == (FILE *)0x0) {
          local_4 = 0;
        }
        else {
          local_16c = __isoc99_fscanf(local_168,"%dK",&local_160);
          fclose(local_168);
          if (local_16c == 1) {
            ncnn::CpuSet::CpuSet((CpuSet *)0x17407f);
            sprintf(local_118,"/sys/devices/system/cpu/cpu%d/cache/index%d/shared_cpu_map",
                    (ulong)local_8,(ulong)local_11c);
            __stream = fopen(local_118,"rb");
            if (__stream == (FILE *)0x0) {
              local_4 = 0;
            }
            else {
              local_2fc = __isoc99_fscanf(__stream,"%255s",local_2f8);
              fclose(__stream);
              if (local_2fc == 1) {
                sVar3 = strlen((char *)local_2f8);
                local_300 = (int)sVar3;
                if ((local_2f8[0] == 0x30) && (local_2f8[1] == 'x')) {
                  local_300 = local_300 + -2;
                }
                local_304 = 0;
                local_308 = local_300;
                while (local_308 = local_308 + -1, -1 < local_308) {
                  local_309 = local_2f8[local_308];
                  if ((local_309 & 1) != 0) {
                    ncnn::CpuSet::enable(&local_1f0,local_304);
                  }
                  if ((local_309 & 2) != 0) {
                    ncnn::CpuSet::enable(&local_1f0,local_304 + 1);
                  }
                  if ((local_309 & 4) != 0) {
                    ncnn::CpuSet::enable(&local_1f0,local_304 + 2);
                  }
                  if ((local_309 & 8) != 0) {
                    ncnn::CpuSet::enable(&local_1f0,local_304 + 3);
                  }
                  local_304 = local_304 + 4;
                }
                iVar2 = ncnn::CpuSet::num_enabled
                                  ((CpuSet *)
                                   CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
                if (iVar2 == 1) {
                  local_4 = local_160 << 10;
                }
                else {
                  local_310 = 0;
                  std::vector<int,_std::allocator<int>_>::vector
                            ((vector<int,_std::allocator<int>_> *)0x174284);
                  for (local_32c = 0; local_32c < g_cpucount; local_32c = local_32c + 1) {
                    bVar1 = ncnn::CpuSet::is_enabled(&local_1f0,local_32c);
                    if ((bVar1) &&
                       (iVar2 = get_thread_siblings(in_stack_fffffffffffffdd0), iVar2 != -1)) {
                      in_stack_fffffffffffffcc0 = in_stack_fffffffffffffcc0 & 0xffffff;
                      pvVar6 = (value_type_conflict3 *)0x0;
                      while (__x = pvVar6,
                            pvVar4 = (value_type_conflict3 *)
                                     std::vector<int,_std::allocator<int>_>::size(&local_328),
                            pvVar6 < pvVar4) {
                        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                           (&local_328,(size_type)__x);
                        if (*pvVar5 == iVar2) {
                          in_stack_fffffffffffffcc0 = CONCAT13(1,(int3)in_stack_fffffffffffffcc0);
                          break;
                        }
                        pvVar6 = (value_type_conflict3 *)((long)__x + 1);
                      }
                      if ((in_stack_fffffffffffffcc0 & 0x1000000) == 0) {
                        std::vector<int,_std::allocator<int>_>::push_back
                                  ((vector<int,_std::allocator<int>_> *)
                                   CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),__x
                                  );
                        local_310 = local_310 + 1;
                      }
                    }
                  }
                  std::vector<int,_std::allocator<int>_>::~vector
                            ((vector<int,_std::allocator<int>_> *)
                             CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
                  local_4 = (local_160 / local_310 + 3) / 4 << 0xc;
                }
              }
              else {
                fprintf(_stderr,"fscanf shared_cpu_map error %d",(ulong)local_2fc);
                fprintf(_stderr,"\n");
                local_4 = 0;
              }
            }
          }
          else {
            fprintf(_stderr,"fscanf cache_size_K error %d",(ulong)local_16c);
            fprintf(_stderr,"\n");
            local_4 = 0;
          }
        }
      }
      return local_4;
    }
    local_12c = -1;
    local_130 = __isoc99_fscanf(local_128,"%d",&local_12c);
    fclose(local_128);
    if ((local_130 == 1) && (local_12c == local_c)) {
      sprintf(local_118,"/sys/devices/system/cpu/cpu%d/cache/index%d/type",(ulong)local_8,
              (ulong)local_120);
      local_138 = fopen(local_118,"rb");
      if (local_138 == (FILE *)0x0) goto LAB_00173f6d;
      local_15c = __isoc99_fscanf(local_138,"%31s",local_158);
      fclose(local_138);
      if ((local_15c == 1) &&
         ((iVar2 = strcmp(local_158,"Data"), iVar2 == 0 ||
          (iVar2 = strcmp(local_158,"Unified"), iVar2 == 0)))) {
        local_11c = local_120;
        goto LAB_00173f6d;
      }
    }
    local_120 = local_120 + 1;
  } while( true );
}

Assistant:

static int get_data_cache_size(int cpuid, int level)
{
    char path[256];

    // discover sysfs cache entry
    int indexid = -1;
    for (int i = 0;; i++)
    {
        // check level
        {
            sprintf(path, "/sys/devices/system/cpu/cpu%d/cache/index%d/level", cpuid, i);
            FILE* fp = fopen(path, "rb");
            if (!fp)
                break;

            int cache_level = -1;
            int nscan = fscanf(fp, "%d", &cache_level);
            fclose(fp);
            if (nscan != 1 || cache_level != level)
                continue;
        }

        // check type
        {
            sprintf(path, "/sys/devices/system/cpu/cpu%d/cache/index%d/type", cpuid, i);
            FILE* fp = fopen(path, "rb");
            if (!fp)
                break;

            char type[32];
            int nscan = fscanf(fp, "%31s", type);
            fclose(fp);
            if (nscan != 1 || (strcmp(type, "Data") != 0 && strcmp(type, "Unified") != 0))
                continue;
        }

        indexid = i;
        break;
    }

    if (indexid == -1)
    {
        // no sysfs entry
        return 0;
    }

    // get size
    int cache_size_K = 0;
    {
        sprintf(path, "/sys/devices/system/cpu/cpu%d/cache/index%d/size", cpuid, indexid);
        FILE* fp = fopen(path, "rb");
        if (!fp)
            return 0;

        int nscan = fscanf(fp, "%dK", &cache_size_K);
        fclose(fp);
        if (nscan != 1)
        {
            NCNN_LOGE("fscanf cache_size_K error %d", nscan);
            return 0;
        }
    }

    // parse shared_cpu_map mask
    ncnn::CpuSet shared_cpu_map;
    {
        sprintf(path, "/sys/devices/system/cpu/cpu%d/cache/index%d/shared_cpu_map", cpuid, indexid);
        FILE* fp = fopen(path, "rb");
        if (!fp)
            return 0;

        char shared_cpu_map_str[256];
        int nscan = fscanf(fp, "%255s", shared_cpu_map_str);
        fclose(fp);
        if (nscan != 1)
        {
            NCNN_LOGE("fscanf shared_cpu_map error %d", nscan);
            return 0;
        }

        int len = strlen(shared_cpu_map_str);

        if (shared_cpu_map_str[0] == '0' && shared_cpu_map_str[1] == 'x')
        {
            // skip leading 0x
            len -= 2;
        }

        int ci = 0;
        for (int i = len - 1; i >= 0; i--)
        {
            char x = shared_cpu_map_str[i];
            if (x & 1) shared_cpu_map.enable(ci + 0);
            if (x & 2) shared_cpu_map.enable(ci + 1);
            if (x & 4) shared_cpu_map.enable(ci + 2);
            if (x & 8) shared_cpu_map.enable(ci + 3);

            ci += 4;
        }
    }

    if (shared_cpu_map.num_enabled() == 1)
        return cache_size_K * 1024;

    // resolve physical cpu count in the shared_cpu_map
    int shared_physical_cpu_count = 0;
    {
        std::vector<int> thread_set;
        for (int i = 0; i < g_cpucount; i++)
        {
            if (!shared_cpu_map.is_enabled(i))
                continue;

            int thread_siblings = get_thread_siblings(i);
            if (thread_siblings == -1)
            {
                // ignore malformed one
                continue;
            }

            bool thread_siblings_exists = false;
            for (size_t j = 0; j < thread_set.size(); j++)
            {
                if (thread_set[j] == thread_siblings)
                {
                    thread_siblings_exists = true;
                    break;
                }
            }

            if (!thread_siblings_exists)
            {
                thread_set.push_back(thread_siblings);
                shared_physical_cpu_count++;
            }
        }
    }

    // return per-physical-core cache size with 4K aligned
    cache_size_K = (cache_size_K / shared_physical_cpu_count + 3) / 4 * 4;

    return cache_size_K * 1024;
}